

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O0

string * HeadingText_abi_cxx11_(double h)

{
  const_iterator ppcVar1;
  string *in_RDI;
  double in_XMM0_Qa;
  char *sCard;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<const_char_*> *__range1;
  double card;
  double CARDINAL_HALF_SEGMENT;
  initializer_list<const_char_*> *in_stack_fffffffffffffef0;
  allocator<char> local_e5 [5];
  allocator<char> *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  const_iterator local_c0;
  char *local_b8 [16];
  initializer_list<const_char_*> local_38;
  initializer_list<const_char_*> *local_28;
  double local_20;
  undefined8 local_18;
  double local_10;
  
  local_18 = 0x4026800000000000;
  local_10 = HeadingNormalize(in_XMM0_Qa);
  local_20 = 0.0;
  memcpy(local_b8,&DAT_0046bc00,0x80);
  local_38._M_array = local_b8;
  local_38._M_len = 0x10;
  local_28 = &local_38;
  local_c0 = std::initializer_list<const_char_*>::begin(local_28);
  ppcVar1 = std::initializer_list<const_char_*>::end(in_stack_fffffffffffffef0);
  while( true ) {
    if (local_c0 == ppcVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
      std::allocator<char>::~allocator(local_e5);
      return in_RDI;
    }
    in_stack_ffffffffffffff30 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*local_c0;
    if (local_10 <= local_20 + 11.25) break;
    local_20 = local_20 + 22.5;
    local_c0 = local_c0 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff2f);
  return in_RDI;
}

Assistant:

std::string HeadingText (double h)
{
    constexpr double CARDINAL_HALF_SEGMENT = 360.0 / 16.0 / 2.0;
    h = HeadingNormalize(h);
    double card = 0.0;
    for (const char* sCard: { "N", "NNE", "NE", "ENE",
                              "E", "ESE", "SE", "SSE",
                              "S", "SSW", "SW", "WSW",
                              "W", "WNW", "NW", "NNW" })
    {
        if (h <= card + CARDINAL_HALF_SEGMENT)
            return sCard;
        card += CARDINAL_HALF_SEGMENT * 2.0;
    }
    return "N";
}